

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O2

size_t len_to_mask(size_t len)

{
  ulong uVar1;
  
  uVar1 = len - 0x10 >> 2;
  if ((len << 0x3e | uVar1) < 7) {
    return *(size_t *)(&DAT_0051cf20 + uVar1 * 8);
  }
  return 0;
}

Assistant:

static size_t len_to_mask(size_t len)
{
    switch (len) {
    case BIP39_ENTROPY_LEN_128: return 0xf0;
    case BIP39_ENTROPY_LEN_160: return 0xf8;
    case BIP39_ENTROPY_LEN_192: return 0xfc;
    case BIP39_ENTROPY_LEN_224: return 0xfe;
    case BIP39_ENTROPY_LEN_256: return 0xff;
    case BIP39_ENTROPY_LEN_288: return 0x80ff;
    case BIP39_ENTROPY_LEN_320: return 0xC0ff;
    }
    return 0;
}